

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# slghpattern.cc
# Opt level: O1

bool __thiscall PatternBlock::isInstructionMatch(PatternBlock *this,ParserWalker *walker)

{
  uintm uVar1;
  ulong uVar2;
  int bytestart;
  ulong uVar3;
  bool bVar4;
  
  if (this->nonzerosize < 1) {
    return this->nonzerosize == 0;
  }
  bVar4 = (this->maskvec).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
          super__Vector_impl_data._M_finish ==
          (this->maskvec).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
          super__Vector_impl_data._M_start;
  if (!bVar4) {
    bytestart = this->offset;
    uVar3 = 0;
    do {
      uVar1 = ParserContext::getInstructionBytes
                        (walker->const_context,bytestart,4,walker->point->offset);
      if ((uVar1 & (this->maskvec).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                   _M_impl.super__Vector_impl_data._M_start[uVar3]) !=
          (this->valvec).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
          super__Vector_impl_data._M_start[uVar3]) {
        return false;
      }
      bytestart = bytestart + 4;
      uVar3 = uVar3 + 1;
      uVar2 = (long)(this->maskvec).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                    _M_impl.super__Vector_impl_data._M_finish -
              (long)(this->maskvec).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                    _M_impl.super__Vector_impl_data._M_start >> 2;
      bVar4 = uVar2 <= uVar3;
    } while (uVar3 < uVar2);
  }
  return bVar4;
}

Assistant:

bool PatternBlock::isInstructionMatch(ParserWalker &walker) const

{
  if (nonzerosize<=0) return (nonzerosize==0);
  int4 off = offset;
  for(int4 i=0;i<maskvec.size();++i) {
    uintm data = walker.getInstructionBytes(off,sizeof(uintm));
    if ((maskvec[i] & data)!=valvec[i]) return false;
    off += sizeof(uintm);
  }
  return true;
}